

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_option_name_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  pointer pcVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,is_positional) == 0) {
    Option::get_name_abi_cxx11_(__return_storage_ptr__,opt,false,true);
  }
  else if ((opt->super_OptionBase<CLI::Option>).group_._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (opt->pname_)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (opt->pname_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_name(const Option *opt, bool is_positional) const {
    if(is_positional)
        return opt->get_name(true, false);

    return opt->get_name(false, true);
}